

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O1

int fse(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  lVar7 = *user_data;
  dVar5 = *(double *)((long)user_data + 0x40);
  dVar6 = *(double *)((long)user_data + 0x48);
  dVar3 = *(double *)((long)user_data + 0x50);
  dVar4 = *(double *)((long)user_data + 8);
  lVar10 = N_VGetArrayPointer();
  if (lVar10 == 0) {
    fse_cold_2();
  }
  else {
    puVar11 = (undefined8 *)N_VGetArrayPointer(ydot);
    if (puVar11 != (undefined8 *)0x0) {
      N_VConst(0,ydot);
      if (2 < lVar7) {
        auVar14._0_8_ = dVar5 * -0.5;
        auVar14._8_8_ = dVar6 * -0.5;
        auVar15._8_4_ = SUB84(dVar4,0);
        auVar15._0_8_ = dVar4;
        auVar15._12_4_ = (int)((ulong)dVar4 >> 0x20);
        auVar15 = divpd(auVar14,auVar15);
        lVar13 = lVar7 + -2;
        lVar12 = 0;
        do {
          dVar5 = *(double *)(lVar10 + 0x40 + lVar12);
          dVar8 = ((double *)(lVar10 + lVar12))[1];
          pdVar1 = (double *)(lVar10 + 0x30 + lVar12);
          dVar9 = pdVar1[1];
          dVar6 = *(double *)(lVar10 + 0x10 + lVar12);
          pdVar2 = (double *)((long)puVar11 + lVar12 + 0x18);
          *pdVar2 = (*pdVar1 - *(double *)(lVar10 + lVar12)) * auVar15._0_8_;
          pdVar2[1] = (dVar9 - dVar8) * auVar15._8_8_;
          *(double *)((long)puVar11 + lVar12 + 0x28) = (dVar5 - dVar6) * ((dVar3 * -0.5) / dVar4);
          lVar12 = lVar12 + 0x18;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11[2] = 0;
      puVar11[(lVar7 + -1) * 3 + 2] = 0;
      puVar11[(lVar7 + -1) * 3] = 0;
      (puVar11 + (lVar7 + -1) * 3)[1] = 0;
      return 0;
    }
    fse_cold_1();
  }
  return 1;
}

Assistant:

static int fse(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data; /* access problem data */
  sunindextype N     = udata->N;            /* set variable shortcuts */
  sunrealtype au     = udata->au;
  sunrealtype av     = udata->av;
  sunrealtype aw     = udata->aw;
  sunrealtype dx     = udata->dx;
  sunrealtype *Ydata = NULL, *dYdata = NULL;
  sunrealtype auconst, avconst, awconst, ul, ur, vl, vr, wl, wr;
  sunindextype i;

  Ydata = N_VGetArrayPointer(y); /* access data arrays */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }
  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  auconst = -au / SUN_RCONST(2.0) / dx;
  avconst = -av / SUN_RCONST(2.0) / dx;
  awconst = -aw / SUN_RCONST(2.0) / dx;
  for (i = 1; i < N - 1; i++)
  {
    /* set shortcuts */
    ul = Ydata[IDX(i - 1, 0)];
    ur = Ydata[IDX(i + 1, 0)];
    vl = Ydata[IDX(i - 1, 1)];
    vr = Ydata[IDX(i + 1, 1)];
    wl = Ydata[IDX(i - 1, 2)];
    wr = Ydata[IDX(i + 1, 2)];

    /* Fill in ODE RHS for u */
    dYdata[IDX(i, 0)] = (ur - ul) * auconst;

    /* Fill in ODE RHS for v */
    dYdata[IDX(i, 1)] = (vr - vl) * avconst;

    /* Fill in ODE RHS for w */
    dYdata[IDX(i, 2)] = (wr - wl) * awconst;
  }

  /* enforce stationary boundaries */
  dYdata[IDX(0, 0)] = dYdata[IDX(0, 1)] = dYdata[IDX(0, 2)] = 0.0;
  dYdata[IDX(N - 1, 0)] = dYdata[IDX(N - 1, 1)] = dYdata[IDX(N - 1, 2)] = 0.0;

  /* Return with success */
  return 0;
}